

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::
MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
::OneQuarterTest(MainTestClass<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_unsigned_int_*)>
                 *this)

{
  int iVar1;
  uint8_t *__s;
  long lVar2;
  undefined8 *puVar3;
  aom_bit_depth_t aVar4;
  undefined2 uVar5;
  size_t i;
  size_t sVar6;
  long lVar7;
  size_t i_2;
  size_t i_1;
  long lVar8;
  SEARCH_METHODS *message;
  char in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  AssertHelper local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  RegisterStateCheckMMX reg_check_mmx;
  uint expected;
  uint var;
  uint sse;
  
  iVar1 = (this->params_).block_size;
  __s = this->src_;
  reg_check_mmx.pre_fpu_env_[0]._0_1_ = in_FPUControlWord;
  if ((this->params_).use_high_bit_depth == false) {
    memset(__s,0xff,(long)iVar1);
    sVar6 = (size_t)(iVar1 / 2);
    memset(this->ref_,0xff,sVar6);
    memset(this->ref_ + sVar6,0,sVar6);
  }
  else {
    aVar4 = (this->params_).bit_depth;
    for (sVar6 = 0; uVar5 = (undefined2)(0xff << ((char)aVar4 - AOM_BITS_8 & 0x1f)),
        (long)iVar1 != sVar6; sVar6 = sVar6 + 1) {
      *(undefined2 *)(sVar6 * 2 + (long)__s * 2) = uVar5;
    }
    lVar2 = (long)this->ref_ * 2;
    lVar7 = (long)(iVar1 / 2);
    for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
      *(undefined2 *)(lVar2 + lVar8 * 2) = uVar5;
    }
    for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
      *(undefined2 *)(lVar2 + lVar7 * 2 + lVar8 * 2) = 0;
    }
  }
  reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
  reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
  iVar1 = (this->params_).width;
  reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
  var = (*(this->params_).func)(this->src_,iVar1,this->ref_,iVar1,&sse);
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
  expected = ((this->params_).block_size * 0xfe01) / 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&reg_check_mmx,"expected","var",&expected,&var);
  if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
    testing::Message::Message((Message *)&local_48);
    puVar3 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar3 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*puVar3;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
               ,0x308,(char *)message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(reg_check_mmx.pre_fpu_env_ + 4));
  return;
}

Assistant:

void MainTestClass<VarianceFunctionType>::OneQuarterTest() {
  const int half = block_size() / 2;
  if (!use_high_bit_depth()) {
    memset(src_, 255, block_size());
    memset(ref_, 255, half);
    memset(ref_ + half, 0, half);
  } else {
    aom_memset16(CONVERT_TO_SHORTPTR(src_), 255 << byte_shift(), block_size());
    aom_memset16(CONVERT_TO_SHORTPTR(ref_), 255 << byte_shift(), half);
    aom_memset16(CONVERT_TO_SHORTPTR(ref_) + half, 0, half);
  }
  unsigned int sse, var, expected;
  API_REGISTER_STATE_CHECK(
      var = params_.func(src_, width(), ref_, width(), &sse));
  expected = block_size() * 255 * 255 / 4;
  EXPECT_EQ(expected, var);
}